

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O0

int joust(monst *mon,obj *obj)

{
  boolean bVar1;
  int iVar2;
  int local_24;
  int joust_dieroll;
  int skill_rating;
  obj *obj_local;
  monst *mon_local;
  
  if ((((u.uprops[0x25].intrinsic == 0) && (u.uprops[0x25].extrinsic == 0)) &&
      (u.uprops[0x1b].intrinsic == 0)) && ((u.umonnum != 0x9e && ((youmonst.data)->mlet != '\x1c')))
     ) {
    if ((obj == uwep) || ((obj == uswapwep && (u.twoweap != '\0')))) {
      iVar2 = weapon_type(obj);
      local_24 = (int)u.weapon_skills[iVar2].skill;
      if ((u.twoweap != '\0') && (u.weapon_skills[0x26].skill < local_24)) {
        local_24 = (int)u.weapon_skills[0x26].skill;
      }
      if (local_24 == 0) {
        local_24 = 1;
      }
      iVar2 = rn2(5);
      if (iVar2 < local_24) {
        if ((((iVar2 == 0) && (iVar2 = rnl(0x32), iVar2 == 0x31)) &&
            ((mon->data->mflags1 & 0x100000) == 0)) &&
           (bVar1 = obj_resists(obj,0,100), bVar1 == '\0')) {
          return -1;
        }
        mon_local._4_4_ = 1;
      }
      else {
        mon_local._4_4_ = 0;
      }
    }
    else {
      mon_local._4_4_ = 0;
    }
  }
  else {
    mon_local._4_4_ = 0;
  }
  return mon_local._4_4_;
}

Assistant:

static int joust(struct monst *mon,	/* target */
		 struct obj *obj)	/* weapon */
{
    int skill_rating, joust_dieroll;

    if (Fumbling || Stunned) return 0;
    /* sanity check; lance must be wielded in order to joust */
    if (obj != uwep && (obj != uswapwep || !u.twoweap)) return 0;

    /* if using two weapons, use worse of lance and two-weapon skills */
    skill_rating = P_SKILL(weapon_type(obj));	/* lance skill */
    if (u.twoweap && P_SKILL(P_TWO_WEAPON_COMBAT) < skill_rating)
	skill_rating = P_SKILL(P_TWO_WEAPON_COMBAT);
    if (skill_rating == P_ISRESTRICTED) skill_rating = P_UNSKILLED; /* 0=>1 */

    /* odds to joust are expert:80%, skilled:60%, basic:40%, unskilled:20% */
    if ((joust_dieroll = rn2(5)) < skill_rating) {
	if (joust_dieroll == 0 && rnl(50) == (50-1) &&
		!unsolid(mon->data) && !obj_resists(obj, 0, 100))
	    return -1;	/* hit that breaks lance */
	return 1;	/* successful joust */
    }
    return 0;	/* no joust bonus; revert to ordinary attack */
}